

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O1

double __thiscall pstore::broker::command_processor::log(command_processor *this,double __x)

{
  ulong uVar1;
  pointer pcVar2;
  long lVar3;
  undefined8 *puVar4;
  not_null<const_char_*> nVar5;
  long *plVar6;
  long *plVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *destination;
  undefined8 *puVar8;
  long *in_FS_OFFSET;
  undefined4 extraout_XMM0_Da;
  double dVar9;
  undefined4 extraout_XMM0_Db;
  string message;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  char *local_58;
  undefined8 local_50;
  char local_48;
  undefined7 uStack_47;
  not_null<const_char_*> local_38;
  
  local_50 = 0;
  local_48 = '\0';
  local_58 = &local_48;
  std::__cxx11::string::reserve((ulong)&local_58);
  std::operator+(&local_78,"verb:",in_RSI);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_78);
  plVar7 = plVar6 + 2;
  if ((long *)*plVar6 == plVar7) {
    local_88 = *plVar7;
    lStack_80 = plVar6[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *plVar7;
    local_98 = (long *)*plVar6;
  }
  local_90 = plVar6[1];
  *plVar6 = (long)plVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_58,(string *)&local_98);
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  uVar1 = in_RSI[1]._M_string_length;
  if (uVar1 < 0x20) {
    pcVar2 = in_RSI[1]._M_dataplus._M_p;
    local_98 = &local_88;
    std::__cxx11::string::_M_construct<char*>((string *)&local_98,pcVar2,pcVar2 + uVar1);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_78,(ulong)(in_RSI + 1));
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_78);
    plVar7 = plVar6 + 2;
    if ((long *)*plVar6 == plVar7) {
      local_88 = *plVar7;
      lStack_80 = plVar6[3];
      local_98 = &local_88;
    }
    else {
      local_88 = *plVar7;
      local_98 = (long *)*plVar6;
    }
    local_90 = plVar6[1];
    *plVar6 = (long)plVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
  }
  std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_98);
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if ((0x1f < uVar1) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2)) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_38.ptr_ = local_58;
  pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_38);
  nVar5.ptr_ = local_38.ptr_;
  dVar9 = (double)pstore::details::log_destinations::__tls_init();
  lVar3 = *in_FS_OFFSET;
  if (*(long *)(lVar3 + -8) != 0) {
    dVar9 = (double)pstore::details::log_destinations::__tls_init();
    puVar8 = *(undefined8 **)(lVar3 + -8);
    puVar4 = (undefined8 *)puVar8[1];
    for (puVar8 = (undefined8 *)*puVar8; puVar8 != puVar4; puVar8 = puVar8 + 1) {
      dVar9 = (double)(**(code **)(*(long *)*puVar8 + 0x48))((long *)*puVar8,6,nVar5.ptr_);
    }
  }
  if (local_58 != &local_48) {
    operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
    dVar9 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  }
  return dVar9;
}

Assistant:

void command_processor::log (broker_command const & c) const {
            static constexpr char const verb[] = "verb:";
            static constexpr auto verb_length = array_elements (verb) - 1;
            static constexpr char const path[] = " path:";
            static constexpr auto path_length = array_elements (path) - 1;
            static constexpr auto max_path_length = std::size_t{32};
            static constexpr char const ellipsis[] = "...";
            static constexpr auto ellipsis_length = array_elements (ellipsis) - 1;

            std::string message;
            message.reserve (verb_length + c.verb.length () + path_length + max_path_length +
                             ellipsis_length);

            message = verb + c.verb + path;
            message += (c.path.length () < max_path_length)
                           ? c.path
                           : (c.path.substr (0, max_path_length) + ellipsis);
            pstore::log (priority::info, message.c_str ());
        }